

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O3

void ComputeEmitterChannelCoefficients
               (ConfigInfo *curConfig,F3DAUDIO_BASIS *listenerBasis,float innerRadius,
               F3DAUDIO_VECTOR channelPosition,float attenuation,float LFEattenuation,uint32_t flags
               ,uint32_t currentChannel,uint32_t numSrcChannels,float *pMatrixCoefficients)

{
  float fVar1;
  uint32_t uVar2;
  SpeakerInfo *pSVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  uVar14 = flags >> 0x10;
  fVar15 = (listenerBasis->top).x;
  fVar17 = (listenerBasis->top).y;
  fVar18 = (listenerBasis->top).z;
  fVar19 = fVar18 * channelPosition.z + fVar15 * channelPosition.x + channelPosition.y * fVar17;
  fVar16 = channelPosition.x - fVar15 * fVar19;
  fVar21 = channelPosition.y - fVar17 * fVar19;
  fVar17 = channelPosition.z - fVar19 * fVar18;
  fVar15 = (float)SDL_sqrtf(fVar17 * fVar17 + fVar16 * fVar16 + fVar21 * fVar21);
  if (fVar15 <= 1e-07) {
    fVar19 = 1.0;
    fVar20 = 0.0;
    fVar18 = 0.0;
LAB_00109ae1:
    uVar9 = curConfig->numNonLFSpeakers;
    uVar7 = 0xffffffff;
    uVar8 = uVar9;
    if ((uVar14 & 1) != 0) {
      uVar8 = uVar9 - 1;
      uVar7 = curConfig->speakers->matrixIdx;
    }
    if (uVar9 != 0) {
      pSVar3 = curConfig->speakers;
      uVar11 = 0;
      do {
        uVar2 = pSVar3[uVar11].matrixIdx;
        if (((flags >> 0x10 & 1) == 0) || (uVar2 != uVar7)) {
          uVar5 = uVar2 * numSrcChannels + currentChannel;
          pMatrixCoefficients[uVar5] =
               pMatrixCoefficients[uVar5] + (fVar19 * attenuation) / (float)uVar8;
        }
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
LAB_00109b8a:
    if (0.0 < fVar18) goto LAB_00109b96;
  }
  else {
    if (innerRadius <= 4e-07) {
      innerRadius = 4e-07;
    }
    fVar15 = fVar15 / innerRadius;
    if (fVar15 <= 0.5) {
      fVar19 = 1.0 - (fVar15 + fVar15);
      fVar18 = fVar19 * 0.0 + (fVar15 + fVar15) * 0.707107;
      fVar20 = (1.0 - fVar19) - fVar18;
      if (0.0 < fVar19) goto LAB_00109ae1;
      goto LAB_00109b8a;
    }
    fVar20 = 0.0;
    fVar18 = 1.0;
    if (fVar15 <= 1.0) {
      fVar18 = fVar15 + -0.5 + fVar15 + -0.5;
      fVar18 = (1.0 - fVar18) * 0.707107 + fVar18;
      fVar20 = 1.0 - fVar18;
      goto LAB_00109b8a;
    }
LAB_00109b96:
    fVar15 = (float)SDL_atan2f((listenerBasis->right).z * fVar17 +
                               (listenerBasis->right).x * fVar16 + (listenerBasis->right).y * fVar21
                               ,(listenerBasis->front).z * fVar17 +
                                (listenerBasis->front).x * fVar16 +
                                (listenerBasis->front).y * fVar21);
    fVar15 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar15 |
                    (uint)(fVar15 + 6.2831855) & -(uint)(fVar15 < 0.0));
    uVar9 = curConfig->numNonLFSpeakers;
    uVar11 = (ulong)uVar9;
    if (uVar11 == 0) {
      uVar8 = 0;
      uVar6 = 0;
      uVar11 = 0;
      if ((uVar14 & 1) != 0) {
LAB_00109cc8:
        uVar6 = uVar11;
        uVar8 = uVar9 - 1;
      }
    }
    else {
      uVar13 = 0;
      do {
        uVar12 = uVar13 + 1;
        uVar6 = uVar12 & 0xffffffff;
        if (uVar11 - 1 == uVar13) {
          uVar6 = 0;
        }
        fVar19 = curConfig->speakers[uVar13].azimuth;
        fVar1 = curConfig->speakers[uVar6].azimuth;
        uVar10 = uVar13;
        if (fVar1 <= fVar19) {
          if (fVar19 <= fVar15) break;
LAB_00109c74:
          if (fVar15 < fVar1) break;
        }
        else if (fVar19 <= fVar15) goto LAB_00109c74;
        uVar10 = uVar11;
        uVar13 = uVar12;
      } while (uVar11 != uVar12);
      uVar8 = (uint)uVar10;
      if ((uVar14 & 1) != 0) {
        if ((fVar19 != 0.0) || (NAN(fVar19))) {
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            uVar4 = (int)uVar6 + 1;
            uVar5 = 0;
            if (uVar9 <= uVar4) {
              uVar5 = uVar9;
            }
            uVar6 = (ulong)(uVar4 - uVar5);
          }
        }
        else {
          uVar11 = uVar6;
          if (uVar8 == 0) goto LAB_00109cc8;
          uVar8 = uVar8 - 1;
        }
      }
    }
    pSVar3 = curConfig->speakers;
    fVar19 = pSVar3[uVar8].azimuth;
    if (pSVar3[uVar6].azimuth < fVar19) {
      fVar15 = (float)(-(uint)(fVar15 < fVar19) & (uint)fVar15 |
                      ~-(uint)(fVar15 < fVar19) & (uint)(fVar15 + -6.2831855));
      fVar19 = fVar19 + -6.2831855;
    }
    fVar15 = (fVar15 - fVar19) / (pSVar3[uVar6].azimuth - fVar19);
    uVar9 = pSVar3[uVar8].matrixIdx * numSrcChannels + currentChannel;
    uVar7 = pSVar3[uVar6].matrixIdx;
    pMatrixCoefficients[uVar9] = (1.0 - fVar15) * fVar18 * attenuation + pMatrixCoefficients[uVar9];
    uVar9 = uVar7 * numSrcChannels + currentChannel;
    pMatrixCoefficients[uVar9] = fVar15 * fVar18 * attenuation + pMatrixCoefficients[uVar9];
  }
  if (fVar20 <= 0.0) goto LAB_00109f16;
  fVar15 = (float)SDL_atan2f(fVar17 * (listenerBasis->right).z +
                             fVar16 * (listenerBasis->right).x + fVar21 * (listenerBasis->right).y,
                             (listenerBasis->front).z * fVar17 +
                             (listenerBasis->front).x * fVar16 + (listenerBasis->front).y * fVar21);
  fVar15 = fVar15 + 3.1415927;
  if (0.0 <= fVar15) {
    if (6.2831855 < fVar15) {
      fVar15 = fVar15 + -6.2831855;
    }
  }
  else {
    fVar15 = fVar15 + 6.2831855;
  }
  uVar9 = curConfig->numNonLFSpeakers;
  uVar11 = (ulong)uVar9;
  if (uVar11 == 0) {
    uVar8 = 0;
    uVar6 = 0;
    uVar11 = 0;
    if ((uVar14 & 1) != 0) {
LAB_00109e85:
      uVar6 = uVar11;
      uVar8 = uVar9 - 1;
    }
  }
  else {
    uVar13 = 0;
    do {
      uVar12 = uVar13 + 1;
      uVar6 = uVar12 & 0xffffffff;
      if (uVar11 - 1 == uVar13) {
        uVar6 = 0;
      }
      fVar17 = curConfig->speakers[uVar13].azimuth;
      fVar18 = curConfig->speakers[uVar6].azimuth;
      uVar10 = uVar13;
      if (fVar18 <= fVar17) {
        if (fVar17 <= fVar15) break;
LAB_00109e3c:
        if (fVar15 < fVar18) break;
      }
      else if (fVar17 <= fVar15) goto LAB_00109e3c;
      uVar10 = uVar11;
      uVar13 = uVar12;
    } while (uVar11 != uVar12);
    uVar8 = (uint)uVar10;
    if ((uVar14 & 1) != 0) {
      if ((fVar17 != 0.0) || (NAN(fVar17))) {
        if ((fVar18 == 0.0) && (!NAN(fVar18))) {
          uVar5 = (int)uVar6 + 1;
          uVar14 = 0;
          if (uVar9 <= uVar5) {
            uVar14 = uVar9;
          }
          uVar6 = (ulong)(uVar5 - uVar14);
        }
      }
      else {
        uVar11 = uVar6;
        if (uVar8 == 0) goto LAB_00109e85;
        uVar8 = uVar8 - 1;
      }
    }
  }
  pSVar3 = curConfig->speakers;
  fVar17 = pSVar3[uVar8].azimuth;
  if (pSVar3[uVar6].azimuth < fVar17) {
    fVar15 = (float)(-(uint)(fVar15 < fVar17) & (uint)fVar15 |
                    ~-(uint)(fVar15 < fVar17) & (uint)(fVar15 + -6.2831855));
    fVar17 = fVar17 + -6.2831855;
  }
  fVar15 = (fVar15 - fVar17) / (pSVar3[uVar6].azimuth - fVar17);
  uVar14 = pSVar3[uVar8].matrixIdx * numSrcChannels + currentChannel;
  uVar7 = pSVar3[uVar6].matrixIdx;
  pMatrixCoefficients[uVar14] = (1.0 - fVar15) * fVar20 * attenuation + pMatrixCoefficients[uVar14];
  uVar14 = uVar7 * numSrcChannels + currentChannel;
  pMatrixCoefficients[uVar14] = fVar15 * fVar20 * attenuation + pMatrixCoefficients[uVar14];
LAB_00109f16:
  if ((flags >> 0x11 & 1) != 0) {
    uVar14 = numSrcChannels * curConfig->LFSpeakerIdx + currentChannel;
    pMatrixCoefficients[uVar14] =
         LFEattenuation / (float)numSrcChannels + pMatrixCoefficients[uVar14];
  }
  return;
}

Assistant:

static inline void ComputeEmitterChannelCoefficients(
	const ConfigInfo *curConfig,
	const F3DAUDIO_BASIS *listenerBasis,
	float innerRadius,
	F3DAUDIO_VECTOR channelPosition,
	float attenuation,
	float LFEattenuation,
	uint32_t flags,
	uint32_t currentChannel,
	uint32_t numSrcChannels,
	float *pMatrixCoefficients
) {
	float elevation, radialDistance;
	F3DAUDIO_VECTOR projTopVec, projPlane;
	uint8_t skipCenter = (flags & F3DAUDIO_CALCULATE_ZEROCENTER) ? 1 : 0;
	DiffusionSpeakerFactors diffusionFactors = { 0.0f };

	float x, y;
	float emitterAzimuth;
	float energyPerChannel;
	float totalEnergy;
	uint32_t nChannelsToDiffuseTo;
	uint32_t iS, centerChannelIdx = -1;
	const SpeakerInfo* infos[2];
	float a0, a1, val;
	uint32_t i0, i1;

	/* We project against the listener basis' top vector to get the elevation of the
	 * current emitter channel position.
	 */
	elevation = VectorDot(listenerBasis->top, channelPosition);

	/* To obtain the projection in the front-right plane of the listener's basis of the
	 * emitter channel position, we simply remove the projection against the top vector.
	 * The radial distance is then the length of the projected vector.
	 */
	projTopVec = VectorScale(listenerBasis->top, elevation);
	projPlane = VectorSub(channelPosition, projTopVec);
	radialDistance = VectorLength(projPlane);

	ComputeInnerRadiusDiffusionFactors(
		radialDistance,
		innerRadius,
		diffusionFactors
	);

	/* See the ComputeInnerRadiusDiffusionFactors comment above for more context. */
	/* DIFFUSION_SPEAKERS_ALL corresponds to diffusing part of the sound to all of the
	 * speakers, equally. The amount of sound is determined by the float value
	 * diffusionFactors[DIFFUSION_SPEAKERS_ALL]. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_ALL] > 0.0f)
	{
		nChannelsToDiffuseTo = curConfig->numNonLFSpeakers;
		totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_ALL] * attenuation;

		if (skipCenter)
		{
			nChannelsToDiffuseTo -= 1;
			FAudio_assert(curConfig->speakers[0].azimuth == SPEAKER_AZIMUTH_CENTER);
			centerChannelIdx = curConfig->speakers[0].matrixIdx;
		}

		energyPerChannel = totalEnergy / nChannelsToDiffuseTo;

		for (iS = 0; iS < curConfig->numNonLFSpeakers; iS += 1)
		{
			const uint32_t curSpeakerIdx = curConfig->speakers[iS].matrixIdx;
			if (skipCenter && curSpeakerIdx == centerChannelIdx)
			{
				continue;
			}

			pMatrixCoefficients[curSpeakerIdx * numSrcChannels + currentChannel] += energyPerChannel;
		}
	}

	/* DIFFUSION_SPEAKERS_MATCHING corresponds to sending part of the sound to the speakers closest
	 * (in terms of azimuth) to the current position of the emitter. The amount of sound we shoud send
	 * corresponds here to diffusionFactors[DIFFUSION_SPEAKERS_MATCHING].
	 * We use the FindSpeakerAzimuths function to find the speakers that match. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] > 0.0f)
	{
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_MATCHING] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Now, a critical point: We shouldn't be sending sound to
		 * matching speakers when x and y are close to 0. That's the
		 * contract we get from ComputeInnerRadiusDiffusionFactors,
		 * which checks that we're not too close to the zero distance.
		 * This allows the atan2 calculation to give good results.
		 */

		/* atan2 returns [-PI, PI], but we want [0, 2PI] */
		emitterAzimuth = FAudio_atan2f(y, x);
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	/* DIFFUSION_SPEAKERS_OPPOSITE corresponds to sending part of the sound to the speakers
	 * _opposite_ the ones that are the closest to the current emitter position.
	 * To find these, we simply find the ones that are closest to the current emitter's azimuth + PI
	 * using the FindSpeakerAzimuth function. */
	if (diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] > 0.0f)
	{
		/* This code is similar to the matching speakers code above. */
		const float totalEnergy = diffusionFactors[DIFFUSION_SPEAKERS_OPPOSITE] * attenuation;

		x = VectorDot(listenerBasis->front, projPlane);
		y = VectorDot(listenerBasis->right, projPlane);

		/* Similarly, we expect atan2 to be well behaved here. */
		emitterAzimuth = FAudio_atan2f(y, x);

		/* Opposite speakers lie at azimuth + PI */
		emitterAzimuth += F3DAUDIO_PI;

		/* Normalize to [0; 2PI) range. */
		if (emitterAzimuth < 0.0f)
		{
			emitterAzimuth += F3DAUDIO_2PI;
		}
		else if (emitterAzimuth > F3DAUDIO_2PI)
		{
			emitterAzimuth -= F3DAUDIO_2PI;
		}

		FindSpeakerAzimuths(curConfig, emitterAzimuth, skipCenter, infos);
		a0 = infos[0]->azimuth;
		a1 = infos[1]->azimuth;

		/* The following code is necessary to handle the singularity in
		 * (0 == 2PI). It'll give us a nice, well ordered interval.
		 */
		if (a0 > a1)
		{
			if (emitterAzimuth >= a0)
			{
				emitterAzimuth -= F3DAUDIO_2PI;
			}
			a0 -= F3DAUDIO_2PI;
		}
		FAudio_assert(emitterAzimuth >= a0 && emitterAzimuth <= a1);

		val = (emitterAzimuth - a0) / (a1 - a0);

		i0 = infos[0]->matrixIdx;
		i1 = infos[1]->matrixIdx;

		pMatrixCoefficients[i0 * numSrcChannels + currentChannel] += (1.0f - val) * totalEnergy;
		pMatrixCoefficients[i1 * numSrcChannels + currentChannel] += (       val) * totalEnergy;
	}

	if (flags & F3DAUDIO_CALCULATE_REDIRECT_TO_LFE)
	{
		FAudio_assert(curConfig->LFSpeakerIdx != -1);
		pMatrixCoefficients[curConfig->LFSpeakerIdx * numSrcChannels + currentChannel] += LFEattenuation / numSrcChannels;
	}
}